

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration_test.cc
# Opt level: O2

void __thiscall
prometheus::anon_unknown_0::BasicAuthIntegrationTest::SetUp(BasicAuthIntegrationTest *this)

{
  Exposer *this_00;
  allocator local_59;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  IntegrationTest::SetUp(&this->super_IntegrationTest);
  IntegrationTest::RegisterSomeCounter
            ((IntegrationTest *)&stack0xffffffffffffffc8,(string *)this,&this->counter_name_);
  std::__shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->registry_).super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>
             ,(__shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2> *)
              &stack0xffffffffffffffc8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd0);
  this_00 = (this->super_IntegrationTest).exposer_._M_t.
            super___uniq_ptr_impl<prometheus::Exposer,_std::default_delete<prometheus::Exposer>_>.
            _M_t.
            super__Tuple_impl<0UL,_prometheus::Exposer_*,_std::default_delete<prometheus::Exposer>_>
            .super__Head_base<0UL,_prometheus::Exposer_*,_false>._M_head_impl;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/integration_test.cc:212:9)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/integration_test.cc:212:9)>
             ::_M_manager;
  local_58._M_unused._M_object = this;
  std::__cxx11::string::string((string *)&stack0xffffffffffffffc8,"Some Auth Realm",&local_59);
  Exposer::RegisterAuth
            (this_00,(function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_58,(string *)&stack0xffffffffffffffc8,
             &(this->super_IntegrationTest).default_metrics_path_);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  return;
}

Assistant:

void SetUp() override {
    IntegrationTest::SetUp();

    registry_ = RegisterSomeCounter(counter_name_, default_metrics_path_);

    exposer_->RegisterAuth(
        [&](const std::string& user, const std::string& password) {
          return user == username_ && password == password_;
        },
        "Some Auth Realm", default_metrics_path_);
  }